

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O0

attributes_t * __thiscall tchecker::system::events_t::event_attributes(events_t *this,event_id_t id)

{
  size_t sVar1;
  invalid_argument *this_00;
  const_reference pvVar2;
  event_id_t id_local;
  events_t *this_local;
  
  sVar1 = events_count(this);
  if (sVar1 <= id) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Unknown event");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar2 = std::
           vector<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>::
           operator[](&this->_events_attributes,(ulong)id);
  return pvVar2;
}

Assistant:

tchecker::system::attributes_t const & events_t::event_attributes(tchecker::event_id_t id) const
{
  if (id >= events_count())
    throw std::invalid_argument("Unknown event");
  return _events_attributes[id];
}